

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

cmRulePlaceholderExpander * __thiscall
cmLocalNinjaGenerator::CreateRulePlaceholderExpander(cmLocalNinjaGenerator *this)

{
  cmRulePlaceholderExpander *this_00;
  allocator local_49;
  string local_48;
  cmRulePlaceholderExpander *local_18;
  cmRulePlaceholderExpander *ret;
  cmLocalNinjaGenerator *this_local;
  
  ret = (cmRulePlaceholderExpander *)this;
  this_00 = (cmRulePlaceholderExpander *)operator_new(0xc0);
  cmRulePlaceholderExpander::cmRulePlaceholderExpander
            (this_00,&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Compilers,
             &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.VariableMappings,
             &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.CompilerSysroot,
             &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.LinkerSysroot);
  local_18 = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"$TARGET_IMPLIB",&local_49);
  cmRulePlaceholderExpander::SetTargetImpLib(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return local_18;
}

Assistant:

cmRulePlaceholderExpander*
cmLocalNinjaGenerator::CreateRulePlaceholderExpander() const
{
  cmRulePlaceholderExpander* ret =
    new cmRulePlaceholderExpander(this->Compilers, this->VariableMappings,
                                  this->CompilerSysroot, this->LinkerSysroot);
  ret->SetTargetImpLib("$TARGET_IMPLIB");
  return ret;
}